

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O2

void __thiscall scriptnum_tests::operators::test_method(operators *this)

{
  int64_t *num1;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int64_t *num2;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar2 = 0; lVar2 != 0xd; lVar2 = lVar2 + 1) {
    num1 = &values + lVar2;
    for (lVar5 = 0; lVar5 != 0x48; lVar5 = lVar5 + 8) {
      RunOperators(num1,num1);
      lVar4 = *num1;
      local_40 = -lVar4;
      RunOperators(num1,&local_40);
      num2 = (int64_t *)((long)&values + lVar5);
      RunOperators(num1,num2);
      lVar1 = *(long *)((long)&values + lVar5);
      lVar3 = -lVar1;
      local_40 = lVar3;
      RunOperators(num1,&local_40);
      lVar6 = lVar1 + lVar4;
      local_40 = lVar6;
      RunOperators(&local_40,num2);
      local_48 = lVar3;
      local_40 = lVar6;
      RunOperators(&local_40,&local_48);
      lVar4 = lVar4 - lVar1;
      local_40 = lVar4;
      RunOperators(&local_40,num2);
      local_48 = lVar3;
      local_40 = lVar4;
      RunOperators(&local_40,&local_48);
      local_48 = lVar6;
      local_40 = lVar6;
      RunOperators(&local_40,&local_48);
      local_48 = lVar4;
      local_40 = lVar6;
      RunOperators(&local_40,&local_48);
      local_48 = lVar6;
      local_40 = lVar4;
      RunOperators(&local_40,&local_48);
      local_48 = lVar4;
      local_40 = lVar4;
      RunOperators(&local_40,&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(operators)
{
    for(size_t i = 0; i < std::size(values); ++i)
    {
        for(size_t j = 0; j < std::size(offsets); ++j)
        {
            RunOperators(values[i], values[i]);
            RunOperators(values[i], -values[i]);
            RunOperators(values[i], values[j]);
            RunOperators(values[i], -values[j]);
            RunOperators(values[i] + values[j], values[j]);
            RunOperators(values[i] + values[j], -values[j]);
            RunOperators(values[i] - values[j], values[j]);
            RunOperators(values[i] - values[j], -values[j]);
            RunOperators(values[i] + values[j], values[i] + values[j]);
            RunOperators(values[i] + values[j], values[i] - values[j]);
            RunOperators(values[i] - values[j], values[i] + values[j]);
            RunOperators(values[i] - values[j], values[i] - values[j]);
        }
    }
}